

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleTabletEvent(QWidgetWindow *this,QTabletEvent *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined2 uVar4;
  Data *pDVar5;
  int iVar6;
  QWidget *pQVar7;
  QPoint QVar8;
  QPoint QVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 *puVar12;
  long in_FS_OFFSET;
  byte bVar13;
  QTabletEvent *pQVar14;
  qreal qVar15;
  QPointF QVar16;
  QPointF QVar17;
  QPoint local_b8;
  qreal local_b0;
  QTabletEvent ev;
  double local_48;
  double dStack_40;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (handleTabletEvent(QTabletEvent*)::qt_tablet_target == '\0') {
    iVar6 = __cxa_guard_acquire(&handleTabletEvent(QTabletEvent*)::qt_tablet_target);
    if (iVar6 != 0) {
      __cxa_atexit(QPointer<QWidget>::~QPointer,&handleTabletEvent::qt_tablet_target,0x7fe000);
      __cxa_guard_release(&handleTabletEvent(QTabletEvent*)::qt_tablet_target);
    }
  }
  if ((handleTabletEvent::qt_tablet_target.wp.d == (Data *)0x0) ||
     (pQVar7 = (QWidget *)handleTabletEvent::qt_tablet_target.wp.value,
     handleTabletEvent::qt_tablet_target.wp.value == (QObject *)0x0 ||
     *(int *)(handleTabletEvent::qt_tablet_target.wp.d + 4) == 0)) {
    pDVar5 = (this->m_widget).wp.d;
    if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
      pQVar7 = (QWidget *)0x0;
    }
    else {
      pQVar7 = (QWidget *)(this->m_widget).wp.value;
    }
    QVar16 = QSinglePointEvent::position((QSinglePointEvent *)event);
    _ev = QVar16.xp;
    pQVar7 = QWidget::childAt(pQVar7,(QPointF *)&ev);
    if (pQVar7 == (QWidget *)0x0) {
      pDVar5 = (this->m_widget).wp.d;
      if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      else {
        pQVar7 = (QWidget *)(this->m_widget).wp.value;
      }
    }
    if (*(short *)(event + 8) == 0x5c) {
      QWeakPointer<QObject>::assign<QObject>
                (&handleTabletEvent::qt_tablet_target.wp,&pQVar7->super_QObject);
    }
    if (pQVar7 == (QWidget *)0x0) goto LAB_0031582a;
  }
  QVar16 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  QVar17 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  _ev = QVar17.xp;
  QVar8 = QPointF::toPoint((QPointF *)&ev);
  local_48 = -NAN;
  dStack_40 = -NAN;
  QVar17 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  _ev = QVar17.xp;
  local_b8 = QPointF::toPoint((QPointF *)&ev);
  QVar9 = QWidget::mapFromGlobal(pQVar7,&local_b8);
  local_48 = (double)QVar9.xp.m_i.m_i + (QVar16.xp - (double)QVar8.xp.m_i.m_i);
  dStack_40 = (double)QVar9.yp.m_i.m_i + (QVar16.yp - (double)QVar8.yp.m_i.m_i);
  puVar12 = &DAT_005eb750;
  pQVar14 = &ev;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    *(undefined8 *)pQVar14 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
    pQVar14 = pQVar14 + (ulong)bVar13 * -0x10 + 8;
  }
  uVar4 = *(undefined2 *)(event + 8);
  uVar10 = QPointerEvent::pointingDevice();
  QVar16 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  local_b8 = (QPoint)QVar16.xp;
  local_b0 = QVar16.yp;
  pQVar14 = (QTabletEvent *)QTabletEvent::pressure(event);
  uVar1 = *(undefined4 *)(event + 0x50);
  uVar2 = *(undefined4 *)(event + 0x54);
  uVar3 = *(undefined4 *)(event + 0x58);
  qVar15 = QTabletEvent::rotation(event);
  QTabletEvent::QTabletEvent
            (pQVar14,uVar2,uVar3,uVar1,SUB84(qVar15,0),*(undefined4 *)(event + 0x5c),&ev,uVar4,
             uVar10,&local_48,&local_b8,*(undefined4 *)(event + 0x20),*(undefined4 *)(event + 0x40),
             *(undefined4 *)(event + 0x44));
  QPointerEvent::setTimestamp((ulonglong)&ev);
  QPointerEvent::setAccepted(SUB81(&ev,0));
  QCoreApplication::forwardEvent(&pQVar7->super_QObject,(QEvent *)&ev,(QEvent *)event);
  (**(code **)(*(long *)event + 0x10))(event);
  QTabletEvent::~QTabletEvent(&ev);
LAB_0031582a:
  if ((*(short *)(event + 8) == 0x5d) && (*(int *)(event + 0x44) == 0)) {
    QWeakPointer<QObject>::assign<QObject>(&handleTabletEvent::qt_tablet_target.wp,(QObject *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleTabletEvent(QTabletEvent *event)
{
    static QPointer<QWidget> qt_tablet_target = nullptr;

    QWidget *widget = qt_tablet_target;

    if (!widget) {
        widget = m_widget->childAt(event->position());
        if (!widget)
            widget = m_widget;
        if (event->type() == QEvent::TabletPress)
            qt_tablet_target = widget;
    }

    if (widget) {
        QPointF delta = event->globalPosition() - event->globalPosition().toPoint();
        QPointF mapped = widget->mapFromGlobal(event->globalPosition().toPoint()) + delta;
        QTabletEvent ev(event->type(), event->pointingDevice(), mapped, event->globalPosition(),
                        event->pressure(), event->xTilt(), event->yTilt(), event->tangentialPressure(),
                        event->rotation(), event->z(), event->modifiers(), event->button(), event->buttons());
        ev.setTimestamp(event->timestamp());
        ev.setAccepted(false);
        QGuiApplication::forwardEvent(widget, &ev, event);
        event->setAccepted(ev.isAccepted());
    }

    if (event->type() == QEvent::TabletRelease && event->buttons() == Qt::NoButton)
        qt_tablet_target = nullptr;
}